

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Z80Storage.cpp
# Opt level: O0

void __thiscall CPU::Z80::ProcessorStorage::install_default_instruction_set(ProcessorStorage *this)

{
  HalfCycles local_1218;
  HalfCycles local_1210;
  HalfCycles local_1208;
  HalfCycles local_1200;
  HalfCycles local_11f8;
  HalfCycles local_11f0;
  HalfCycles local_11e8;
  HalfCycles local_11e0;
  HalfCycles local_11d8;
  HalfCycles local_11d0;
  HalfCycles local_11c8;
  HalfCycles local_11c0;
  HalfCycles local_11b8;
  HalfCycles local_11b0;
  HalfCycles local_11a8;
  HalfCycles local_11a0;
  undefined4 local_1198 [2];
  MicroOp irq_mode2_program [22];
  HalfCycles local_c10;
  HalfCycles local_c08;
  HalfCycles local_c00;
  HalfCycles local_bf8;
  HalfCycles local_bf0;
  HalfCycles local_be8;
  HalfCycles local_be0;
  HalfCycles local_bd8;
  HalfCycles local_bd0;
  undefined4 local_bc8 [2];
  MicroOp irq_mode1_program [15];
  HalfCycles local_800;
  HalfCycles local_7f8;
  HalfCycles local_7f0;
  undefined4 local_7e8 [2];
  MicroOp irq_mode0_program [5];
  HalfCycles local_6a0;
  HalfCycles local_698;
  HalfCycles local_690;
  HalfCycles local_688;
  HalfCycles local_680;
  HalfCycles local_678;
  HalfCycles local_670;
  HalfCycles local_668;
  HalfCycles local_660;
  HalfCycles local_658;
  HalfCycles local_650;
  undefined4 local_648 [2];
  MicroOp nmi_program [16];
  HalfCycles local_240;
  undefined4 local_238 [2];
  MicroOp reset_program [3];
  HalfCycles local_170;
  HalfCycles local_168;
  HalfCycles local_160;
  undefined4 local_158 [2];
  MicroOp conditional_call_untaken_program [5];
  ProcessorStorage *this_local;
  
  local_158[0] = 0;
  conditional_call_untaken_program[0].type = BusOperation;
  conditional_call_untaken_program[0]._4_4_ = 0;
  conditional_call_untaken_program[0].source = (void *)0x0;
  HalfCycles::HalfCycles(&local_160,3);
  PartialMachineCycle::PartialMachineCycle
            ((PartialMachineCycle *)&conditional_call_untaken_program[0].destination,ReadStart,
             local_160,&(this->pc_).full,&(this->memptr_).halves.high,false);
  conditional_call_untaken_program[0].machine_cycle.was_requested = false;
  conditional_call_untaken_program[0].machine_cycle._33_3_ = 0;
  conditional_call_untaken_program[1].type = BusOperation;
  conditional_call_untaken_program[1]._4_4_ = 0;
  conditional_call_untaken_program[1].source = (void *)0x0;
  HalfCycles::HalfCycles(&local_168,2);
  PartialMachineCycle::PartialMachineCycle
            ((PartialMachineCycle *)&conditional_call_untaken_program[1].destination,ReadWait,
             local_168,&(this->pc_).full,&(this->memptr_).halves.high,true);
  conditional_call_untaken_program[1].machine_cycle.was_requested = false;
  conditional_call_untaken_program[1].machine_cycle._33_3_ = 0;
  conditional_call_untaken_program[2].type = BusOperation;
  conditional_call_untaken_program[2]._4_4_ = 0;
  conditional_call_untaken_program[2].source = (void *)0x0;
  HalfCycles::HalfCycles(&local_170,3);
  PartialMachineCycle::PartialMachineCycle
            ((PartialMachineCycle *)&conditional_call_untaken_program[2].destination,Read,local_170,
             &(this->pc_).full,&(this->memptr_).halves.high,false);
  conditional_call_untaken_program[2].machine_cycle.was_requested = true;
  conditional_call_untaken_program[2].machine_cycle._33_3_ = 0;
  conditional_call_untaken_program[3]._0_8_ = &this->pc_;
  conditional_call_untaken_program[3].source = (void *)0x0;
  PartialMachineCycle::PartialMachineCycle
            ((PartialMachineCycle *)&conditional_call_untaken_program[3].destination);
  conditional_call_untaken_program[3].machine_cycle.was_requested = true;
  conditional_call_untaken_program[3].machine_cycle._33_3_ = 0;
  conditional_call_untaken_program[4].type = BusOperation;
  conditional_call_untaken_program[4]._4_4_ = 0;
  conditional_call_untaken_program[4].source = (void *)0x0;
  PartialMachineCycle::PartialMachineCycle
            ((PartialMachineCycle *)&conditional_call_untaken_program[4].destination);
  (*this->_vptr_ProcessorStorage[1])(this,local_158,&this->conditional_call_untaken_program_);
  assemble_base_page(this,&this->base_page_,&this->hl_,false,&this->cb_page_);
  assemble_base_page(this,&this->dd_page_,&this->ix_,true,&this->ddcb_page_);
  assemble_base_page(this,&this->fd_page_,&this->iy_,true,&this->fdcb_page_);
  assemble_ed_page(this,&this->ed_page_);
  (this->fd_page_).is_indexed = true;
  (this->fdcb_page_).is_indexed = true;
  (this->dd_page_).is_indexed = true;
  (this->ddcb_page_).is_indexed = true;
  assemble_fetch_decode_execute(this,&this->base_page_,4);
  assemble_fetch_decode_execute(this,&this->dd_page_,4);
  assemble_fetch_decode_execute(this,&this->fd_page_,4);
  assemble_fetch_decode_execute(this,&this->ed_page_,4);
  assemble_fetch_decode_execute(this,&this->cb_page_,4);
  assemble_fetch_decode_execute(this,&this->fdcb_page_,3);
  assemble_fetch_decode_execute(this,&this->ddcb_page_,3);
  local_238[0] = 0;
  reset_program[0].type = BusOperation;
  reset_program[0]._4_4_ = 0;
  reset_program[0].source = (void *)0x0;
  HalfCycles::HalfCycles(&local_240,6);
  PartialMachineCycle::PartialMachineCycle
            ((PartialMachineCycle *)&reset_program[0].destination,Internal,local_240,
             &this->last_address_bus_,(uint8_t *)0x0,false);
  reset_program[0].machine_cycle.was_requested = true;
  reset_program[0].machine_cycle._33_3_ = 0;
  reset_program[1].type = BusOperation;
  reset_program[1]._4_4_ = 0;
  reset_program[1].source = (void *)0x0;
  PartialMachineCycle::PartialMachineCycle((PartialMachineCycle *)&reset_program[1].destination);
  reset_program[1].machine_cycle.was_requested = true;
  reset_program[1].machine_cycle._33_3_ = 0;
  reset_program[2].type = BusOperation;
  reset_program[2]._4_4_ = 0;
  reset_program[2].source = (void *)0x0;
  PartialMachineCycle::PartialMachineCycle((PartialMachineCycle *)&reset_program[2].destination);
  local_648[0] = 0x47;
  nmi_program[0].type = BusOperation;
  nmi_program[0]._4_4_ = 0;
  nmi_program[0].source = (void *)0x0;
  PartialMachineCycle::PartialMachineCycle((PartialMachineCycle *)&nmi_program[0].destination);
  nmi_program[0].machine_cycle.was_requested = false;
  nmi_program[0].machine_cycle._33_3_ = 0;
  nmi_program[1].type = BusOperation;
  nmi_program[1]._4_4_ = 0;
  nmi_program[1].source = (void *)0x0;
  HalfCycles::HalfCycles(&local_650,3);
  PartialMachineCycle::PartialMachineCycle
            ((PartialMachineCycle *)&nmi_program[1].destination,ReadOpcodeStart,local_650,
             &(this->pc_).full,&this->operation_,false);
  nmi_program[1].machine_cycle.was_requested = false;
  nmi_program[1].machine_cycle._33_3_ = 0;
  nmi_program[2].type = BusOperation;
  nmi_program[2]._4_4_ = 0;
  nmi_program[2].source = (void *)0x0;
  HalfCycles::HalfCycles(&local_658,2);
  PartialMachineCycle::PartialMachineCycle
            ((PartialMachineCycle *)&nmi_program[2].destination,ReadOpcodeWait,local_658,
             &(this->pc_).full,&this->operation_,true);
  nmi_program[2].machine_cycle.was_requested = false;
  nmi_program[2].machine_cycle._33_3_ = 0;
  nmi_program[3].type = BusOperation;
  nmi_program[3]._4_4_ = 0;
  nmi_program[3].source = (void *)0x0;
  HalfCycles::HalfCycles(&local_660,1);
  PartialMachineCycle::PartialMachineCycle
            ((PartialMachineCycle *)&nmi_program[3].destination,ReadOpcode,local_660,
             &(this->pc_).full,&this->operation_,false);
  nmi_program[3].machine_cycle.was_requested = false;
  nmi_program[3].machine_cycle._33_3_ = 0;
  nmi_program[4].type = BusOperation;
  nmi_program[4]._4_4_ = 0;
  nmi_program[4].source = (void *)0x0;
  HalfCycles::HalfCycles(&local_668,4);
  PartialMachineCycle::PartialMachineCycle
            ((PartialMachineCycle *)&nmi_program[4].destination,Refresh,local_668,
             &(this->refresh_addr_).full,(uint8_t *)0x0,false);
  nmi_program[4].machine_cycle.was_requested = false;
  nmi_program[4].machine_cycle._33_3_ = 0;
  nmi_program[5].type = BusOperation;
  nmi_program[5]._4_4_ = 0;
  nmi_program[5].source = (void *)0x0;
  HalfCycles::HalfCycles(&local_670,2);
  PartialMachineCycle::PartialMachineCycle
            ((PartialMachineCycle *)&nmi_program[5].destination,Internal,local_670,
             &this->last_address_bus_,(uint8_t *)0x0,false);
  nmi_program[5].machine_cycle.was_requested = true;
  nmi_program[5].machine_cycle._33_3_ = 0;
  nmi_program[6]._0_8_ = &this->sp_;
  nmi_program[6].source = (void *)0x0;
  PartialMachineCycle::PartialMachineCycle((PartialMachineCycle *)&nmi_program[6].destination);
  nmi_program[6].machine_cycle.was_requested = false;
  nmi_program[6].machine_cycle._33_3_ = 0;
  nmi_program[7].type = BusOperation;
  nmi_program[7]._4_4_ = 0;
  nmi_program[7].source = (void *)0x0;
  HalfCycles::HalfCycles(&local_678,3);
  PartialMachineCycle::PartialMachineCycle
            ((PartialMachineCycle *)&nmi_program[7].destination,WriteStart,local_678,
             &(this->sp_).full,&(this->pc_).halves.high,false);
  nmi_program[7].machine_cycle.was_requested = false;
  nmi_program[7].machine_cycle._33_3_ = 0;
  nmi_program[8].type = BusOperation;
  nmi_program[8]._4_4_ = 0;
  nmi_program[8].source = (void *)0x0;
  HalfCycles::HalfCycles(&local_680,2);
  PartialMachineCycle::PartialMachineCycle
            ((PartialMachineCycle *)&nmi_program[8].destination,WriteWait,local_680,
             &(this->sp_).full,&(this->pc_).halves.high,true);
  nmi_program[8].machine_cycle.was_requested = false;
  nmi_program[8].machine_cycle._33_3_ = 0;
  nmi_program[9].type = BusOperation;
  nmi_program[9]._4_4_ = 0;
  nmi_program[9].source = (void *)0x0;
  HalfCycles::HalfCycles(&local_688,3);
  PartialMachineCycle::PartialMachineCycle
            ((PartialMachineCycle *)&nmi_program[9].destination,Write,local_688,&(this->sp_).full,
             &(this->pc_).halves.high,false);
  nmi_program[9].machine_cycle.was_requested = true;
  nmi_program[9].machine_cycle._33_3_ = 0;
  nmi_program[10]._0_8_ = &this->sp_;
  nmi_program[10].source = (void *)0x0;
  PartialMachineCycle::PartialMachineCycle((PartialMachineCycle *)&nmi_program[10].destination);
  nmi_program[10].machine_cycle.was_requested = false;
  nmi_program[10].machine_cycle._33_3_ = 0;
  nmi_program[0xb].type = BusOperation;
  nmi_program[0xb]._4_4_ = 0;
  nmi_program[0xb].source = (void *)0x0;
  HalfCycles::HalfCycles(&local_690,3);
  PartialMachineCycle::PartialMachineCycle
            ((PartialMachineCycle *)&nmi_program[0xb].destination,WriteStart,local_690,
             &(this->sp_).full,(uint8_t *)&(this->pc_).full,false);
  nmi_program[0xb].machine_cycle.was_requested = false;
  nmi_program[0xb].machine_cycle._33_3_ = 0;
  nmi_program[0xc].type = BusOperation;
  nmi_program[0xc]._4_4_ = 0;
  nmi_program[0xc].source = (void *)0x0;
  HalfCycles::HalfCycles(&local_698,2);
  PartialMachineCycle::PartialMachineCycle
            ((PartialMachineCycle *)&nmi_program[0xc].destination,WriteWait,local_698,
             &(this->sp_).full,(uint8_t *)&(this->pc_).full,true);
  nmi_program[0xc].machine_cycle.was_requested = false;
  nmi_program[0xc].machine_cycle._33_3_ = 0;
  nmi_program[0xd].type = BusOperation;
  nmi_program[0xd]._4_4_ = 0;
  nmi_program[0xd].source = (void *)0x0;
  HalfCycles::HalfCycles(&local_6a0,3);
  PartialMachineCycle::PartialMachineCycle
            ((PartialMachineCycle *)&nmi_program[0xd].destination,Write,local_6a0,&(this->sp_).full,
             (uint8_t *)&(this->pc_).full,false);
  nmi_program[0xd].machine_cycle.was_requested = true;
  nmi_program[0xd].machine_cycle._33_3_ = 0;
  nmi_program[0xe].type = BusOperation;
  nmi_program[0xe]._4_4_ = 0;
  nmi_program[0xe].source = (void *)0x0;
  PartialMachineCycle::PartialMachineCycle((PartialMachineCycle *)&nmi_program[0xe].destination);
  nmi_program[0xe].machine_cycle.was_requested = true;
  nmi_program[0xe].machine_cycle._33_3_ = 0;
  nmi_program[0xf].type = BusOperation;
  nmi_program[0xf]._4_4_ = 0;
  nmi_program[0xf].source = (void *)0x0;
  PartialMachineCycle::PartialMachineCycle((PartialMachineCycle *)&nmi_program[0xf].destination);
  local_7e8[0] = 0x49;
  irq_mode0_program[0].type = BusOperation;
  irq_mode0_program[0]._4_4_ = 0;
  irq_mode0_program[0].source = (void *)0x0;
  PartialMachineCycle::PartialMachineCycle((PartialMachineCycle *)&irq_mode0_program[0].destination)
  ;
  irq_mode0_program[0].machine_cycle.was_requested = false;
  irq_mode0_program[0].machine_cycle._33_3_ = 0;
  irq_mode0_program[1].type = BusOperation;
  irq_mode0_program[1]._4_4_ = 0;
  irq_mode0_program[1].source = (void *)0x0;
  HalfCycles::HalfCycles(&local_7f0,5);
  PartialMachineCycle::PartialMachineCycle
            ((PartialMachineCycle *)&irq_mode0_program[1].destination,InterruptStart,local_7f0,
             &(this->pc_).full,&this->operation_,false);
  irq_mode0_program[1].machine_cycle.was_requested = false;
  irq_mode0_program[1].machine_cycle._33_3_ = 0;
  irq_mode0_program[2].type = BusOperation;
  irq_mode0_program[2]._4_4_ = 0;
  irq_mode0_program[2].source = (void *)0x0;
  HalfCycles::HalfCycles(&local_7f8,2);
  PartialMachineCycle::PartialMachineCycle
            ((PartialMachineCycle *)&irq_mode0_program[2].destination,InterruptWait,local_7f8,
             &(this->pc_).full,&this->operation_,true);
  irq_mode0_program[2].machine_cycle.was_requested = false;
  irq_mode0_program[2].machine_cycle._33_3_ = 0;
  irq_mode0_program[3].type = BusOperation;
  irq_mode0_program[3]._4_4_ = 0;
  irq_mode0_program[3].source = (void *)0x0;
  HalfCycles::HalfCycles(&local_800,3);
  PartialMachineCycle::PartialMachineCycle
            ((PartialMachineCycle *)&irq_mode0_program[3].destination,Interrupt,local_800,
             &(this->pc_).full,&this->operation_,false);
  irq_mode0_program[3].machine_cycle.was_requested = true;
  irq_mode0_program[3].machine_cycle._33_3_ = 0;
  irq_mode0_program[4].type = BusOperation;
  irq_mode0_program[4]._4_4_ = 0;
  irq_mode0_program[4].source = (void *)0x0;
  PartialMachineCycle::PartialMachineCycle((PartialMachineCycle *)&irq_mode0_program[4].destination)
  ;
  local_bc8[0] = 0x48;
  irq_mode1_program[0].type = BusOperation;
  irq_mode1_program[0]._4_4_ = 0;
  irq_mode1_program[0].source = (void *)0x0;
  PartialMachineCycle::PartialMachineCycle((PartialMachineCycle *)&irq_mode1_program[0].destination)
  ;
  irq_mode1_program[0].machine_cycle.was_requested = false;
  irq_mode1_program[0].machine_cycle._33_3_ = 0;
  irq_mode1_program[1].type = BusOperation;
  irq_mode1_program[1]._4_4_ = 0;
  irq_mode1_program[1].source = (void *)0x0;
  HalfCycles::HalfCycles(&local_bd0,7);
  PartialMachineCycle::PartialMachineCycle
            ((PartialMachineCycle *)&irq_mode1_program[1].destination,InterruptStart,local_bd0,
             &(this->pc_).full,&this->operation_,false);
  irq_mode1_program[1].machine_cycle.was_requested = false;
  irq_mode1_program[1].machine_cycle._33_3_ = 0;
  irq_mode1_program[2].type = BusOperation;
  irq_mode1_program[2]._4_4_ = 0;
  irq_mode1_program[2].source = (void *)0x0;
  HalfCycles::HalfCycles(&local_bd8,2);
  PartialMachineCycle::PartialMachineCycle
            ((PartialMachineCycle *)&irq_mode1_program[2].destination,InterruptWait,local_bd8,
             &(this->pc_).full,&this->operation_,true);
  irq_mode1_program[2].machine_cycle.was_requested = false;
  irq_mode1_program[2].machine_cycle._33_3_ = 0;
  irq_mode1_program[3].type = BusOperation;
  irq_mode1_program[3]._4_4_ = 0;
  irq_mode1_program[3].source = (void *)0x0;
  HalfCycles::HalfCycles(&local_be0,3);
  PartialMachineCycle::PartialMachineCycle
            ((PartialMachineCycle *)&irq_mode1_program[3].destination,Interrupt,local_be0,
             &(this->pc_).full,&this->operation_,false);
  irq_mode1_program[3].machine_cycle.was_requested = false;
  irq_mode1_program[3].machine_cycle._33_3_ = 0;
  irq_mode1_program[4].type = BusOperation;
  irq_mode1_program[4]._4_4_ = 0;
  irq_mode1_program[4].source = (void *)0x0;
  HalfCycles::HalfCycles(&local_be8,4);
  PartialMachineCycle::PartialMachineCycle
            ((PartialMachineCycle *)&irq_mode1_program[4].destination,Refresh,local_be8,
             &(this->refresh_addr_).full,(uint8_t *)0x0,false);
  irq_mode1_program[4].machine_cycle.was_requested = true;
  irq_mode1_program[4].machine_cycle._33_3_ = 0;
  irq_mode1_program[5]._0_8_ = &this->sp_;
  irq_mode1_program[5].source = (void *)0x0;
  PartialMachineCycle::PartialMachineCycle((PartialMachineCycle *)&irq_mode1_program[5].destination)
  ;
  irq_mode1_program[5].machine_cycle.was_requested = false;
  irq_mode1_program[5].machine_cycle._33_3_ = 0;
  irq_mode1_program[6].type = BusOperation;
  irq_mode1_program[6]._4_4_ = 0;
  irq_mode1_program[6].source = (void *)0x0;
  HalfCycles::HalfCycles(&local_bf0,3);
  PartialMachineCycle::PartialMachineCycle
            ((PartialMachineCycle *)&irq_mode1_program[6].destination,WriteStart,local_bf0,
             &(this->sp_).full,&(this->pc_).halves.high,false);
  irq_mode1_program[6].machine_cycle.was_requested = false;
  irq_mode1_program[6].machine_cycle._33_3_ = 0;
  irq_mode1_program[7].type = BusOperation;
  irq_mode1_program[7]._4_4_ = 0;
  irq_mode1_program[7].source = (void *)0x0;
  HalfCycles::HalfCycles(&local_bf8,2);
  PartialMachineCycle::PartialMachineCycle
            ((PartialMachineCycle *)&irq_mode1_program[7].destination,WriteWait,local_bf8,
             &(this->sp_).full,&(this->pc_).halves.high,true);
  irq_mode1_program[7].machine_cycle.was_requested = false;
  irq_mode1_program[7].machine_cycle._33_3_ = 0;
  irq_mode1_program[8].type = BusOperation;
  irq_mode1_program[8]._4_4_ = 0;
  irq_mode1_program[8].source = (void *)0x0;
  HalfCycles::HalfCycles(&local_c00,3);
  PartialMachineCycle::PartialMachineCycle
            ((PartialMachineCycle *)&irq_mode1_program[8].destination,Write,local_c00,
             &(this->sp_).full,&(this->pc_).halves.high,false);
  irq_mode1_program[8].machine_cycle.was_requested = true;
  irq_mode1_program[8].machine_cycle._33_3_ = 0;
  irq_mode1_program[9]._0_8_ = &this->sp_;
  irq_mode1_program[9].source = (void *)0x0;
  PartialMachineCycle::PartialMachineCycle((PartialMachineCycle *)&irq_mode1_program[9].destination)
  ;
  irq_mode1_program[9].machine_cycle.was_requested = false;
  irq_mode1_program[9].machine_cycle._33_3_ = 0;
  irq_mode1_program[10].type = BusOperation;
  irq_mode1_program[10]._4_4_ = 0;
  irq_mode1_program[10].source = (void *)0x0;
  HalfCycles::HalfCycles(&local_c08,3);
  PartialMachineCycle::PartialMachineCycle
            ((PartialMachineCycle *)&irq_mode1_program[10].destination,WriteStart,local_c08,
             &(this->sp_).full,(uint8_t *)&(this->pc_).full,false);
  irq_mode1_program[10].machine_cycle.was_requested = false;
  irq_mode1_program[10].machine_cycle._33_3_ = 0;
  irq_mode1_program[0xb].type = BusOperation;
  irq_mode1_program[0xb]._4_4_ = 0;
  irq_mode1_program[0xb].source = (void *)0x0;
  HalfCycles::HalfCycles(&local_c10,2);
  PartialMachineCycle::PartialMachineCycle
            ((PartialMachineCycle *)&irq_mode1_program[0xb].destination,WriteWait,local_c10,
             &(this->sp_).full,(uint8_t *)&(this->pc_).full,true);
  irq_mode1_program[0xb].machine_cycle.was_requested = false;
  irq_mode1_program[0xb].machine_cycle._33_3_ = 0;
  irq_mode1_program[0xc].type = BusOperation;
  irq_mode1_program[0xc]._4_4_ = 0;
  irq_mode1_program[0xc].source = (void *)0x0;
  HalfCycles::HalfCycles((HalfCycles *)&irq_mode2_program[0x15].machine_cycle.was_requested,3);
  PartialMachineCycle::PartialMachineCycle
            ((PartialMachineCycle *)&irq_mode1_program[0xc].destination,Write,
             (HalfCycles)irq_mode2_program[0x15].machine_cycle._32_8_,&(this->sp_).full,
             (uint8_t *)&(this->pc_).full,false);
  irq_mode1_program[0xc].machine_cycle.was_requested = true;
  irq_mode1_program[0xc].machine_cycle._33_3_ = 0;
  irq_mode1_program[0xd]._0_8_ = &this->temp16_;
  irq_mode1_program[0xd].source = &this->pc_;
  PartialMachineCycle::PartialMachineCycle
            ((PartialMachineCycle *)&irq_mode1_program[0xd].destination);
  irq_mode1_program[0xd].machine_cycle.was_requested = true;
  irq_mode1_program[0xd].machine_cycle._33_3_ = 0;
  irq_mode1_program[0xe].type = BusOperation;
  irq_mode1_program[0xe]._4_4_ = 0;
  irq_mode1_program[0xe].source = (void *)0x0;
  PartialMachineCycle::PartialMachineCycle
            ((PartialMachineCycle *)&irq_mode1_program[0xe].destination);
  local_1198[0] = 0x48;
  irq_mode2_program[0].type = BusOperation;
  irq_mode2_program[0]._4_4_ = 0;
  irq_mode2_program[0].source = (void *)0x0;
  PartialMachineCycle::PartialMachineCycle((PartialMachineCycle *)&irq_mode2_program[0].destination)
  ;
  irq_mode2_program[0].machine_cycle.was_requested = false;
  irq_mode2_program[0].machine_cycle._33_3_ = 0;
  irq_mode2_program[1].type = BusOperation;
  irq_mode2_program[1]._4_4_ = 0;
  irq_mode2_program[1].source = (void *)0x0;
  HalfCycles::HalfCycles(&local_11a0,7);
  PartialMachineCycle::PartialMachineCycle
            ((PartialMachineCycle *)&irq_mode2_program[1].destination,InterruptStart,local_11a0,
             &(this->pc_).full,(uint8_t *)&(this->temp16_).full,false);
  irq_mode2_program[1].machine_cycle.was_requested = false;
  irq_mode2_program[1].machine_cycle._33_3_ = 0;
  irq_mode2_program[2].type = BusOperation;
  irq_mode2_program[2]._4_4_ = 0;
  irq_mode2_program[2].source = (void *)0x0;
  HalfCycles::HalfCycles(&local_11a8,2);
  PartialMachineCycle::PartialMachineCycle
            ((PartialMachineCycle *)&irq_mode2_program[2].destination,InterruptWait,local_11a8,
             &(this->pc_).full,(uint8_t *)&(this->temp16_).full,true);
  irq_mode2_program[2].machine_cycle.was_requested = false;
  irq_mode2_program[2].machine_cycle._33_3_ = 0;
  irq_mode2_program[3].type = BusOperation;
  irq_mode2_program[3]._4_4_ = 0;
  irq_mode2_program[3].source = (void *)0x0;
  HalfCycles::HalfCycles(&local_11b0,3);
  PartialMachineCycle::PartialMachineCycle
            ((PartialMachineCycle *)&irq_mode2_program[3].destination,Interrupt,local_11b0,
             &(this->pc_).full,(uint8_t *)&(this->temp16_).full,false);
  irq_mode2_program[3].machine_cycle.was_requested = false;
  irq_mode2_program[3].machine_cycle._33_3_ = 0;
  irq_mode2_program[4].type = BusOperation;
  irq_mode2_program[4]._4_4_ = 0;
  irq_mode2_program[4].source = (void *)0x0;
  HalfCycles::HalfCycles(&local_11b8,4);
  PartialMachineCycle::PartialMachineCycle
            ((PartialMachineCycle *)&irq_mode2_program[4].destination,Refresh,local_11b8,
             &(this->refresh_addr_).full,(uint8_t *)0x0,false);
  irq_mode2_program[4].machine_cycle.was_requested = true;
  irq_mode2_program[4].machine_cycle._33_3_ = 0;
  irq_mode2_program[5]._0_8_ = &this->sp_;
  irq_mode2_program[5].source = (void *)0x0;
  PartialMachineCycle::PartialMachineCycle((PartialMachineCycle *)&irq_mode2_program[5].destination)
  ;
  irq_mode2_program[5].machine_cycle.was_requested = false;
  irq_mode2_program[5].machine_cycle._33_3_ = 0;
  irq_mode2_program[6].type = BusOperation;
  irq_mode2_program[6]._4_4_ = 0;
  irq_mode2_program[6].source = (void *)0x0;
  HalfCycles::HalfCycles(&local_11c0,3);
  PartialMachineCycle::PartialMachineCycle
            ((PartialMachineCycle *)&irq_mode2_program[6].destination,WriteStart,local_11c0,
             &(this->sp_).full,&(this->pc_).halves.high,false);
  irq_mode2_program[6].machine_cycle.was_requested = false;
  irq_mode2_program[6].machine_cycle._33_3_ = 0;
  irq_mode2_program[7].type = BusOperation;
  irq_mode2_program[7]._4_4_ = 0;
  irq_mode2_program[7].source = (void *)0x0;
  HalfCycles::HalfCycles(&local_11c8,2);
  PartialMachineCycle::PartialMachineCycle
            ((PartialMachineCycle *)&irq_mode2_program[7].destination,WriteWait,local_11c8,
             &(this->sp_).full,&(this->pc_).halves.high,true);
  irq_mode2_program[7].machine_cycle.was_requested = false;
  irq_mode2_program[7].machine_cycle._33_3_ = 0;
  irq_mode2_program[8].type = BusOperation;
  irq_mode2_program[8]._4_4_ = 0;
  irq_mode2_program[8].source = (void *)0x0;
  HalfCycles::HalfCycles(&local_11d0,3);
  PartialMachineCycle::PartialMachineCycle
            ((PartialMachineCycle *)&irq_mode2_program[8].destination,Write,local_11d0,
             &(this->sp_).full,&(this->pc_).halves.high,false);
  irq_mode2_program[8].machine_cycle.was_requested = true;
  irq_mode2_program[8].machine_cycle._33_3_ = 0;
  irq_mode2_program[9]._0_8_ = &this->sp_;
  irq_mode2_program[9].source = (void *)0x0;
  PartialMachineCycle::PartialMachineCycle((PartialMachineCycle *)&irq_mode2_program[9].destination)
  ;
  irq_mode2_program[9].machine_cycle.was_requested = false;
  irq_mode2_program[9].machine_cycle._33_3_ = 0;
  irq_mode2_program[10].type = BusOperation;
  irq_mode2_program[10]._4_4_ = 0;
  irq_mode2_program[10].source = (void *)0x0;
  HalfCycles::HalfCycles(&local_11d8,3);
  PartialMachineCycle::PartialMachineCycle
            ((PartialMachineCycle *)&irq_mode2_program[10].destination,WriteStart,local_11d8,
             &(this->sp_).full,(uint8_t *)&(this->pc_).full,false);
  irq_mode2_program[10].machine_cycle.was_requested = false;
  irq_mode2_program[10].machine_cycle._33_3_ = 0;
  irq_mode2_program[0xb].type = BusOperation;
  irq_mode2_program[0xb]._4_4_ = 0;
  irq_mode2_program[0xb].source = (void *)0x0;
  HalfCycles::HalfCycles(&local_11e0,2);
  PartialMachineCycle::PartialMachineCycle
            ((PartialMachineCycle *)&irq_mode2_program[0xb].destination,WriteWait,local_11e0,
             &(this->sp_).full,(uint8_t *)&(this->pc_).full,true);
  irq_mode2_program[0xb].machine_cycle.was_requested = false;
  irq_mode2_program[0xb].machine_cycle._33_3_ = 0;
  irq_mode2_program[0xc].type = BusOperation;
  irq_mode2_program[0xc]._4_4_ = 0;
  irq_mode2_program[0xc].source = (void *)0x0;
  HalfCycles::HalfCycles(&local_11e8,3);
  PartialMachineCycle::PartialMachineCycle
            ((PartialMachineCycle *)&irq_mode2_program[0xc].destination,Write,local_11e8,
             &(this->sp_).full,(uint8_t *)&(this->pc_).full,false);
  irq_mode2_program[0xc].machine_cycle.was_requested = true;
  irq_mode2_program[0xc].machine_cycle._33_3_ = 0;
  irq_mode2_program[0xd]._0_8_ = (long)&this->ir_ + 1;
  irq_mode2_program[0xd].source = (void *)((long)&this->temp16_ + 1);
  PartialMachineCycle::PartialMachineCycle
            ((PartialMachineCycle *)&irq_mode2_program[0xd].destination);
  irq_mode2_program[0xd].machine_cycle.was_requested = false;
  irq_mode2_program[0xd].machine_cycle._33_3_ = 0;
  irq_mode2_program[0xe].type = BusOperation;
  irq_mode2_program[0xe]._4_4_ = 0;
  irq_mode2_program[0xe].source = (void *)0x0;
  HalfCycles::HalfCycles(&local_11f0,3);
  PartialMachineCycle::PartialMachineCycle
            ((PartialMachineCycle *)&irq_mode2_program[0xe].destination,ReadStart,local_11f0,
             &(this->temp16_).full,(uint8_t *)&(this->pc_).full,false);
  irq_mode2_program[0xe].machine_cycle.was_requested = false;
  irq_mode2_program[0xe].machine_cycle._33_3_ = 0;
  irq_mode2_program[0xf].type = BusOperation;
  irq_mode2_program[0xf]._4_4_ = 0;
  irq_mode2_program[0xf].source = (void *)0x0;
  HalfCycles::HalfCycles(&local_11f8,2);
  PartialMachineCycle::PartialMachineCycle
            ((PartialMachineCycle *)&irq_mode2_program[0xf].destination,ReadWait,local_11f8,
             &(this->temp16_).full,(uint8_t *)&(this->pc_).full,true);
  irq_mode2_program[0xf].machine_cycle.was_requested = false;
  irq_mode2_program[0xf].machine_cycle._33_3_ = 0;
  irq_mode2_program[0x10].type = BusOperation;
  irq_mode2_program[0x10]._4_4_ = 0;
  irq_mode2_program[0x10].source = (void *)0x0;
  HalfCycles::HalfCycles(&local_1200,3);
  PartialMachineCycle::PartialMachineCycle
            ((PartialMachineCycle *)&irq_mode2_program[0x10].destination,Read,local_1200,
             &(this->temp16_).full,(uint8_t *)&(this->pc_).full,false);
  irq_mode2_program[0x10].machine_cycle.was_requested = true;
  irq_mode2_program[0x10].machine_cycle._33_3_ = 0;
  if (&this->temp16_ == &this->pc_) {
    irq_mode2_program[0x10].machine_cycle.was_requested = true;
    irq_mode2_program[0x10].machine_cycle._33_3_ = 0;
  }
  irq_mode2_program[0x11]._0_8_ = &this->temp16_;
  irq_mode2_program[0x11].source = (void *)0x0;
  PartialMachineCycle::PartialMachineCycle
            ((PartialMachineCycle *)&irq_mode2_program[0x11].destination);
  irq_mode2_program[0x11].machine_cycle.was_requested = false;
  irq_mode2_program[0x11].machine_cycle._33_3_ = 0;
  irq_mode2_program[0x12].type = BusOperation;
  irq_mode2_program[0x12]._4_4_ = 0;
  irq_mode2_program[0x12].source = (void *)0x0;
  HalfCycles::HalfCycles(&local_1208,3);
  PartialMachineCycle::PartialMachineCycle
            ((PartialMachineCycle *)&irq_mode2_program[0x12].destination,ReadStart,local_1208,
             &(this->temp16_).full,&(this->pc_).halves.high,false);
  irq_mode2_program[0x12].machine_cycle.was_requested = false;
  irq_mode2_program[0x12].machine_cycle._33_3_ = 0;
  irq_mode2_program[0x13].type = BusOperation;
  irq_mode2_program[0x13]._4_4_ = 0;
  irq_mode2_program[0x13].source = (void *)0x0;
  HalfCycles::HalfCycles(&local_1210,2);
  PartialMachineCycle::PartialMachineCycle
            ((PartialMachineCycle *)&irq_mode2_program[0x13].destination,ReadWait,local_1210,
             &(this->temp16_).full,&(this->pc_).halves.high,true);
  irq_mode2_program[0x13].machine_cycle.was_requested = false;
  irq_mode2_program[0x13].machine_cycle._33_3_ = 0;
  irq_mode2_program[0x14].type = BusOperation;
  irq_mode2_program[0x14]._4_4_ = 0;
  irq_mode2_program[0x14].source = (void *)0x0;
  HalfCycles::HalfCycles(&local_1218,3);
  PartialMachineCycle::PartialMachineCycle
            ((PartialMachineCycle *)&irq_mode2_program[0x14].destination,Read,local_1218,
             &(this->temp16_).full,&(this->pc_).halves.high,false);
  irq_mode2_program[0x14].machine_cycle.was_requested = true;
  irq_mode2_program[0x14].machine_cycle._33_3_ = 0;
  irq_mode2_program[0x15].type = BusOperation;
  irq_mode2_program[0x15]._4_4_ = 0;
  irq_mode2_program[0x15].source = (void *)0x0;
  PartialMachineCycle::PartialMachineCycle
            ((PartialMachineCycle *)&irq_mode2_program[0x15].destination);
  (*this->_vptr_ProcessorStorage[1])(this,local_238,&this->reset_program_);
  (*this->_vptr_ProcessorStorage[1])(this,local_648,&this->nmi_program_);
  (*this->_vptr_ProcessorStorage[1])(this,local_7e8,this->irq_program_);
  (*this->_vptr_ProcessorStorage[1])(this,local_bc8,this->irq_program_ + 1);
  (*this->_vptr_ProcessorStorage[1])(this,local_1198,this->irq_program_ + 2);
  return;
}

Assistant:

void ProcessorStorage::install_default_instruction_set() {
	MicroOp conditional_call_untaken_program[] = Sequence(ReadInc(pc_, memptr_.halves.high));
	copy_program(conditional_call_untaken_program, conditional_call_untaken_program_);

	assemble_base_page(base_page_, hl_, false, cb_page_);
	assemble_base_page(dd_page_, ix_, true, ddcb_page_);
	assemble_base_page(fd_page_, iy_, true, fdcb_page_);
	assemble_ed_page(ed_page_);

	fd_page_.is_indexed = true;
	fdcb_page_.is_indexed = true;
	dd_page_.is_indexed = true;
	ddcb_page_.is_indexed = true;

	assemble_fetch_decode_execute(base_page_, 4);
	assemble_fetch_decode_execute(dd_page_, 4);
	assemble_fetch_decode_execute(fd_page_, 4);
	assemble_fetch_decode_execute(ed_page_, 4);
	assemble_fetch_decode_execute(cb_page_, 4);

	assemble_fetch_decode_execute(fdcb_page_, 3);
	assemble_fetch_decode_execute(ddcb_page_, 3);

	MicroOp reset_program[] = Sequence(InternalOperation(6), {MicroOp::Reset});

	// Justification for NMI timing: per Wilf Rigter on the ZX81 (http://www.user.dccnet.com/wrigter/index_files/ZX81WAIT.htm),
	// wait cycles occur between T2 and T3 during NMI; extending the refresh cycle is also consistent with my guess
	// for the action of other non-four-cycle opcode fetches
	MicroOp nmi_program[] = {
		{ MicroOp::BeginNMI },
		BusOp(ReadOpcodeStart()),
		BusOp(ReadOpcodeWait(true)),
		BusOp(ReadOpcodeEnd()),
		BusOp(Refresh()),
		InternalOperation(2),
		Push(pc_),
		{ MicroOp::JumpTo66 },
		{ MicroOp::MoveToNextProgram }
	};
	MicroOp irq_mode0_program[] = {
		{ MicroOp::BeginIRQMode0 },
		BusOp(IntAckStart(5, operation_)),
		BusOp(IntWait(operation_)),
		BusOp(IntAckEnd(operation_)),
		{ MicroOp::DecodeOperation }
	};
	MicroOp irq_mode1_program[] = {
		{ MicroOp::BeginIRQ },
		BusOp(IntAckStart(7, operation_)),	// 7 half cycles (including  +
		BusOp(IntWait(operation_)),			// [potentially 2 half cycles] +
		BusOp(IntAckEnd(operation_)),		// Implicitly 3 half cycles +
		BusOp(Refresh()),					// 4 half cycles +
		Push(pc_),							// 12 half cycles = 26 half cycles = 13 cycles
		{ MicroOp::Move16, &temp16_.full, &pc_.full },
		{ MicroOp::MoveToNextProgram }
	};
	MicroOp irq_mode2_program[] = {
		{ MicroOp::BeginIRQ },
		BusOp(IntAckStart(7, temp16_.halves.low)),
		BusOp(IntWait(temp16_.halves.low)),
		BusOp(IntAckEnd(temp16_.halves.low)),
		BusOp(Refresh()),
		Push(pc_),
		{ MicroOp::Move8, &ir_.halves.high, &temp16_.halves.high },
		Read16(temp16_, pc_),
		{ MicroOp::MoveToNextProgram }
	};

	copy_program(reset_program, reset_program_);
	copy_program(nmi_program, nmi_program_);
	copy_program(irq_mode0_program, irq_program_[0]);
	copy_program(irq_mode1_program, irq_program_[1]);
	copy_program(irq_mode2_program, irq_program_[2]);
}